

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

tuple<baryonyx::variables,_baryonyx::affected_variables> * __thiscall
anon_unknown.dwarf_132a07::preprocessor<baryonyx::problem>::variables_exclude_copy
          (tuple<baryonyx::variables,_baryonyx::affected_variables> *__return_storage_ptr__,
          preprocessor<baryonyx::problem> *this)

{
  problem *pb;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference __args;
  const_reference pvVar4;
  pointer pvVar5;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_b0;
  key_type local_a4;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_a0;
  const_iterator it;
  size_t e;
  size_t i;
  undefined1 local_78 [8];
  variables ret_vars;
  affected_variables ret_aff_vars;
  preprocessor<baryonyx::problem> *this_local;
  
  pb = this->pb;
  ret_aff_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  sVar2 = std::
          unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
          ::size(&this->vars);
  affected_variable_copy
            ((affected_variables *)
             &ret_vars.values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pb,sVar2);
  baryonyx::variables::variables((variables *)local_78);
  sVar3 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size(&(this->pb->vars).names);
  sVar2 = std::
          unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
          ::size(&this->vars);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_78,sVar3 - sVar2);
  sVar3 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size(&(this->pb->vars).names);
  sVar2 = std::
          unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
          ::size(&this->vars);
  std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::reserve
            ((vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> *)
             &ret_vars.names.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar3 - sVar2);
  e = 0;
  it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_int,_bool>,_false>)
       std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::size
                 (&(this->pb->vars).values);
  for (; (_Node_iterator_base<std::pair<const_int,_bool>,_false>)e !=
         it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur; e = e + 1) {
    local_a4 = (key_type)e;
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::find(&this->vars,&local_a4);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::cend(&this->vars);
    bVar1 = std::__detail::operator==(&local_a0,&local_b0);
    if (bVar1) {
      pvVar4 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(this->pb->vars).names,e);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)local_78,pvVar4);
      __args = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
               operator[](&(this->pb->vars).values,e);
      std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
      emplace_back<baryonyx::variable_value_const&>
                ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>> *)
                 &ret_vars.names.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__args);
    }
    else {
      pvVar4 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(this->pb->vars).names,e);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&ret_vars.values.
                     super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
      pvVar5 = std::__detail::_Node_const_iterator<std::pair<const_int,_bool>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_int,_bool>,_false,_false> *)
                          &local_a0);
      std::vector<signed_char,std::allocator<signed_char>>::emplace_back<bool_const&>
                ((vector<signed_char,std::allocator<signed_char>> *)
                 &ret_aff_vars.names.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar5->second);
    }
  }
  std::make_tuple<baryonyx::variables&,baryonyx::affected_variables&>
            (__return_storage_ptr__,(variables *)local_78,
             (affected_variables *)
             &ret_vars.values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  baryonyx::variables::~variables((variables *)local_78);
  baryonyx::affected_variables::~affected_variables
            ((affected_variables *)
             &ret_vars.values.
              super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

auto variables_exclude_copy() const
      -> std::tuple<bx::variables, bx::affected_variables>
    {
        auto ret_aff_vars = affected_variable_copy(pb, vars.size());

        bx::variables ret_vars;

        ret_vars.names.reserve(pb.vars.names.size() - vars.size());
        ret_vars.values.reserve(pb.vars.names.size() - vars.size());

        for (std::size_t i = 0, e = pb.vars.values.size(); i != e; ++i) {
            auto it = vars.find(static_cast<int>(i));

            if (it == vars.cend()) {
                ret_vars.names.emplace_back(pb.vars.names[i]);
                ret_vars.values.emplace_back(pb.vars.values[i]);
            } else {
                ret_aff_vars.names.emplace_back(pb.vars.names[i]);
                ret_aff_vars.values.emplace_back(it->second);
            }
        }

        return std::make_tuple(ret_vars, ret_aff_vars);
    }